

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O3

void __thiscall
amrex::MLMG::prepareForSolve
          (MLMG *this,Vector<amrex::Any,_std::allocator<amrex::Any>_> *a_sol,
          Vector<amrex::Any,_std::allocator<amrex::Any>_> *a_rhs)

{
  _func_int **pp_Var1;
  pointer pAVar2;
  __uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_> _Var3;
  pointer pAVar4;
  long *plVar5;
  long *plVar6;
  bool bVar7;
  long *plVar8;
  undefined8 uVar9;
  int iVar10;
  int extraout_var;
  MLLinOp *pMVar11;
  long lVar12;
  int extraout_EDX;
  pointer *__ptr;
  ulong uVar13;
  size_type sVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  IntVect ng_sol;
  long *local_1f8;
  undefined8 local_1f0;
  int local_1e8;
  undefined8 local_1e0;
  int local_1d8;
  undefined8 local_1d4;
  int local_1cc;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *local_1c8;
  Vector<amrex::Any,_std::allocator<amrex::Any>_> *local_1c0;
  undefined1 local_1b8 [16];
  _Head_base<0UL,_amrex::Any::innards_base_*,_false> local_1a8;
  undefined8 auStack_1a0 [46];
  
  local_1b8._0_8_ = (innards_base *)0x0;
  local_1c0 = a_rhs;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&(this->timer).super_vector<double,_std::allocator<double>_>,3,
             (value_type_conflict2 *)local_1b8);
  local_1d4 = (innards_base *)0x0;
  local_1cc = 0;
  local_1e0 = (innards_base *)0x100000001;
  local_1d8 = 1;
  pMVar11 = this->linop;
  uVar15 = (ulong)(uint)(pMVar11->info).hidden_direction;
  if (uVar15 < 3) {
    *(undefined4 *)((long)&local_1e0 + uVar15 * 4) = 0;
  }
  pp_Var1 = pMVar11->_vptr_MLLinOp;
  if (this->linop_prepared == false) {
    (*pp_Var1[0x1d])();
    this->linop_prepared = true;
  }
  else {
    iVar10 = (*pp_Var1[7])();
    if ((char)iVar10 != '\0') {
      (*this->linop->_vptr_MLLinOp[8])();
    }
  }
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            (&(this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>,(long)this->namrlevs
            );
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->sol_is_alias).super_vector<int,_std::allocator<int>_>,(long)this->namrlevs);
  sVar14 = (size_type)this->namrlevs;
  if (0 < (long)sVar14) {
    uVar15 = 0;
    do {
      if (this->cf_strategy == ghostnodes) {
        (*this->linop->_vptr_MLLinOp[0x2a])
                  ((_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8,this->linop,
                   (a_sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar15);
        uVar9 = local_1b8._0_8_;
        pAVar2 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_1b8._0_8_ = (innards_base *)0x0;
        _Var3._M_t.
        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
             *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *)
              &pAVar2[uVar15].m_ptr._M_t;
        pAVar2[uVar15].m_ptr._M_t =
             (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
              )uVar9;
        if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )_Var3._M_t.
              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
              .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )0x0) {
          (**(code **)(*(long *)_Var3._M_t.
                                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                _M_head_impl + 0x10))();
        }
        if ((innards_base *)local_1b8._0_8_ != (innards_base *)0x0) {
          (*(*(_func_int ***)local_1b8._0_8_)[2])();
        }
LAB_006294bd:
        iVar10 = 1;
      }
      else {
        iVar10 = (*this->linop->_vptr_MLLinOp[0x2b])
                           (this->linop,
                            (a_sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                            super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                            super__Vector_impl_data._M_start + uVar15);
        if ((((int)local_1e0 == iVar10) && (local_1e0._4_4_ == extraout_var)) &&
           (extraout_EDX == local_1d8)) {
          (*this->linop->_vptr_MLLinOp[0x2a])
                    ((_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8,this->linop,
                     (a_sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                     super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar15);
          uVar9 = local_1b8._0_8_;
          pAVar2 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_1b8._0_8_ = (innards_base *)0x0;
          _Var3._M_t.
          super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
          .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
               *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *
                )&pAVar2[uVar15].m_ptr._M_t;
          pAVar2[uVar15].m_ptr._M_t =
               (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
                )uVar9;
          if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
               )_Var3._M_t.
                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
               )0x0) {
            (**(code **)(*(long *)_Var3._M_t.
                                  super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                  .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                  _M_head_impl + 0x10))();
          }
          if ((innards_base *)local_1b8._0_8_ != (innards_base *)0x0) {
            (*(*(_func_int ***)local_1b8._0_8_)[2])();
          }
          (*this->linop->_vptr_MLLinOp[0x2f])
                    (this->linop,
                     (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                     super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                     super__Vector_impl_data._M_start + uVar15);
          goto LAB_006294bd;
        }
        if (this->solve_called == 0) {
          (*this->linop->_vptr_MLLinOp[0x27])
                    ((_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8,this->linop,
                     uVar15 & 0xffffffff,0,&local_1e0);
          uVar9 = local_1b8._0_8_;
          pAVar2 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_1b8._0_8_ = (innards_base *)0x0;
          _Var3._M_t.
          super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
          .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
               *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *
                )&pAVar2[uVar15].m_ptr._M_t;
          pAVar2[uVar15].m_ptr._M_t =
               (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
                )uVar9;
          if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
               )_Var3._M_t.
                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
               )0x0) {
            (**(code **)(*(long *)_Var3._M_t.
                                  super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                  .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                  _M_head_impl + 0x10))();
          }
          if ((innards_base *)local_1b8._0_8_ != (innards_base *)0x0) {
            (*(*(_func_int ***)local_1b8._0_8_)[2])();
          }
        }
        local_1b8._0_8_ = (innards_base *)0x0;
        local_1b8._8_8_ = local_1b8._8_8_ & 0xffffffff00000000;
        (*this->linop->_vptr_MLLinOp[0x2c])
                  (this->linop,
                   (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar15,
                   (a_sol->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar15,
                   (_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8);
        (*this->linop->_vptr_MLLinOp[0x2f])
                  (this->linop,
                   (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar15);
        iVar10 = 0;
      }
      (this->sol_is_alias).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[uVar15]
           = iVar10;
      uVar15 = uVar15 + 1;
      sVar14 = (size_type)this->namrlevs;
    } while ((long)uVar15 < (long)sVar14);
  }
  local_1c8 = &this->rhs;
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            (&local_1c8->super_vector<amrex::Any,_std::allocator<amrex::Any>_>,sVar14);
  if (0 < this->namrlevs) {
    lVar17 = 0;
    lVar16 = 0;
    uVar15 = 0;
    do {
      pMVar11 = this->linop;
      if (this->cf_strategy == ghostnodes) {
        local_1cc = (*pMVar11->_vptr_MLLinOp[6])(pMVar11,uVar15 & 0xffffffff,0);
        local_1d4 = (innards_base *)CONCAT44(local_1cc,local_1cc);
        pMVar11 = this->linop;
      }
      if (this->solve_called == 0) {
        (*pMVar11->_vptr_MLLinOp[0x27])
                  ((_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8,pMVar11,
                   uVar15 & 0xffffffff,0,&local_1d4);
        uVar9 = local_1b8._0_8_;
        pAVar2 = (local_1c8->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_1b8._0_8_ = (innards_base *)0x0;
        _Var3._M_t.
        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl =
             *(tuple<amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_> *)
              &pAVar2[uVar15].m_ptr._M_t;
        pAVar2[uVar15].m_ptr._M_t =
             (__uniq_ptr_data<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>,_true,_true>
              )uVar9;
        if ((__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )_Var3._M_t.
              super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
              .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
             )0x0) {
          (**(code **)(*(long *)_Var3._M_t.
                                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                _M_head_impl + 0x10))();
        }
        if ((innards_base *)local_1b8._0_8_ != (innards_base *)0x0) {
          (*(*(_func_int ***)local_1b8._0_8_)[2])();
        }
        pMVar11 = this->linop;
      }
      (*pMVar11->_vptr_MLLinOp[0x2c])
                (pMVar11,(long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                  super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>.
                                  _M_impl.super__Vector_impl_data._M_start)->m_ptr)._M_t.
                                super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                _M_head_impl + lVar16,
                 (long)&(((local_1c0->super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar16,&local_1d4);
      (*this->linop->_vptr_MLLinOp[0x15])(this->linop,uVar15 & 0xffffffff,0);
      (*this->linop->_vptr_MLLinOp[0x17])
                (this->linop,uVar15 & 0xffffffff,
                 (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar16);
      (*this->linop->_vptr_MLLinOp[0x18])
                (this->linop,uVar15 & 0xffffffff,
                 (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar16);
      (*this->linop->_vptr_MLLinOp[0x19])
                (this->linop,uVar15 & 0xffffffff,
                 (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar16);
      (*this->linop->_vptr_MLLinOp[0x1a])
                (this->linop,uVar15 & 0xffffffff,
                 (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar16);
      pMVar11 = this->linop;
      lVar12 = **(long **)((long)&(((pMVar11->m_factory).
                                    super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                    .
                                    super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                                  ).
                                  super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar17);
      if (lVar12 != 0) {
        lVar12 = __dynamic_cast(lVar12,&FabFactory<amrex::FArrayBox>::typeinfo,
                                &EBFArrayBoxFactory::typeinfo);
        if (lVar12 != 0) {
          (*pMVar11->_vptr_MLLinOp[0x30])
                    (pMVar11,(long)&(((this->rhs).
                                      super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                                      super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>.
                                      _M_impl.super__Vector_impl_data._M_start)->m_ptr)._M_t.
                                    super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                                    .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                                    _M_head_impl + lVar16);
          (*this->linop->_vptr_MLLinOp[0x30])
                    (this->linop,
                     (long)&(((this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                              super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                              super__Vector_impl_data._M_start)->m_ptr)._M_t.
                            super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                            .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                     lVar16);
        }
      }
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 8;
      lVar17 = lVar17 + 0x18;
    } while ((long)uVar15 < (long)this->namrlevs);
  }
  uVar15 = (ulong)this->finest_amr_lev;
  if (0 < (long)uVar15) {
    lVar16 = uVar15 * 8;
    do {
      pAVar2 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
               super__Vector_impl_data._M_start;
      pAVar4 = (this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
               super__Vector_impl_data._M_start;
      (*this->linop->_vptr_MLLinOp[0x3e])
                (this->linop,uVar15 - 1 & 0xffffffff,
                 (long)&pAVar2[-1].m_ptr._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar16,(long)&pAVar4[-1].m_ptr._M_t.
                               super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                               .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                               _M_head_impl + lVar16,
                 (long)&(pAVar2->m_ptr)._M_t.
                        super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                        .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl +
                 lVar16,(long)&(pAVar4->m_ptr)._M_t.
                               super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                               .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>.
                               _M_head_impl + lVar16);
      lVar16 = lVar16 + -8;
      bVar7 = 1 < uVar15;
      uVar15 = uVar15 - 1;
    } while (bVar7);
  }
  iVar10 = (*this->linop->_vptr_MLLinOp[0x1e])(this->linop,0);
  pMVar11 = this->linop;
  if (((char)iVar10 != '\0') && (pMVar11->enforceSingularSolvable == true)) {
    makeSolvable(this);
    pMVar11 = this->linop;
  }
  if (((pMVar11->m_ixtype).vect[1] == 0 && (pMVar11->m_ixtype).vect[0] == 0) &&
     ((pMVar11->m_ixtype).vect[2] == 0)) {
    local_1e8 = 0;
  }
  else {
    local_1e8 = 1;
  }
  local_1f0 = (innards_base *)CONCAT44(local_1e8,local_1e8);
  if (this->cf_strategy == ghostnodes) {
    local_1e8 = local_1cc;
    local_1f0 = local_1d4;
  }
  if (this->solve_called == 0) {
    MLLinOp::make(pMVar11,&this->res,(IntVect *)&local_1f0);
    MLLinOp::make(this->linop,&this->rescor,(IntVect *)&local_1f0);
  }
  iVar10 = this->finest_amr_lev;
  if (-1 < iVar10) {
    lVar16 = 0;
    do {
      lVar17 = (long)(this->linop->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start[lVar16];
      if (0 < lVar17) {
        lVar12 = 0;
        do {
          (*this->linop->_vptr_MLLinOp[0x2e])
                    (this->linop,
                     *(long *)&(this->res).
                               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar16].
                               super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar12)
          ;
          (*this->linop->_vptr_MLLinOp[0x2e])
                    (this->linop,
                     *(long *)&(this->rescor).
                               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar16].
                               super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar12)
          ;
          lVar12 = lVar12 + 8;
        } while (lVar17 * 8 != lVar12);
        iVar10 = this->finest_amr_lev;
      }
      bVar7 = lVar16 < iVar10;
      lVar16 = lVar16 + 1;
    } while (bVar7);
  }
  if (this->cf_strategy != ghostnodes) {
    local_1e8 = local_1d8;
    local_1f0 = local_1e0;
  }
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::resize(&(this->cor).
            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           ,(long)this->namrlevs);
  if (-1 < this->finest_amr_lev) {
    uVar15 = 0;
    do {
      sVar14 = (size_type)
               (this->linop->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar15];
      std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
                (&(this->cor).
                  super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  .
                  super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar15].
                  super_vector<amrex::Any,_std::allocator<amrex::Any>_>,sVar14);
      if (0 < (long)sVar14) {
        lVar16 = 0;
        uVar13 = 0;
        do {
          if (this->solve_called == 0) {
            local_1b8._8_4_ = local_1e8;
            local_1b8._0_8_ = local_1f0;
            if (this->cf_strategy == ghostnodes) {
              local_1b8._4_4_ =
                   (*this->linop->_vptr_MLLinOp[6])
                             (this->linop,uVar15 & 0xffffffff,uVar13 & 0xffffffff);
              local_1b8._0_4_ = local_1b8._4_4_;
              local_1b8._8_4_ = local_1b8._4_4_;
            }
            (*this->linop->_vptr_MLLinOp[0x27])
                      (&local_1f8,this->linop,uVar15 & 0xffffffff,uVar13 & 0xffffffff,
                       (_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8);
            plVar6 = local_1f8;
            lVar17 = *(long *)&(this->cor).
                               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar15].
                               super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
            local_1f8 = (long *)0x0;
            plVar5 = *(long **)(lVar17 + lVar16);
            *(long **)(lVar17 + lVar16) = plVar6;
            if (plVar5 != (long *)0x0) {
              (**(code **)(*plVar5 + 0x10))();
            }
            if (local_1f8 != (long *)0x0) {
              (**(code **)(*local_1f8 + 0x10))();
            }
          }
          (*this->linop->_vptr_MLLinOp[0x2e])
                    (this->linop,
                     *(long *)&(this->cor).
                               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar15].
                               super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                               super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_> + lVar16)
          ;
          uVar13 = uVar13 + 1;
          lVar16 = lVar16 + 8;
        } while (sVar14 * 8 != lVar16);
      }
      bVar7 = (long)uVar15 < (long)this->finest_amr_lev;
      uVar15 = uVar15 + 1;
    } while (bVar7);
  }
  iVar10 = 2;
  if (2 < this->namrlevs) {
    iVar10 = this->namrlevs;
  }
  std::
  vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
  ::resize(&(this->cor_hold).
            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
           ,(ulong)(iVar10 - 1));
  iVar10 = *(this->linop->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
            (&((this->cor_hold).
               super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
               .
               super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super_vector<amrex::Any,_std::allocator<amrex::Any>_>,(long)iVar10);
  if (1 < (long)iVar10) {
    lVar16 = 0;
    uVar15 = 0;
    do {
      if (this->solve_called == 0) {
        local_1b8._8_4_ = local_1e8;
        local_1b8._0_8_ = local_1f0;
        if (this->cf_strategy == ghostnodes) {
          local_1b8._4_4_ = (*this->linop->_vptr_MLLinOp[6])(this->linop,0,uVar15 & 0xffffffff);
          local_1b8._0_4_ = local_1b8._4_4_;
          local_1b8._8_4_ = local_1b8._4_4_;
        }
        (*this->linop->_vptr_MLLinOp[0x27])
                  (&local_1f8,this->linop,0,uVar15 & 0xffffffff,
                   (_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8);
        plVar6 = local_1f8;
        lVar17 = *(long *)&(((this->cor_hold).
                             super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             .
                             super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>;
        local_1f8 = (long *)0x0;
        plVar5 = *(long **)(lVar17 + lVar16);
        *(long **)(lVar17 + lVar16) = plVar6;
        if (plVar5 != (long *)0x0) {
          (**(code **)(*plVar5 + 0x10))();
        }
        if (local_1f8 != (long *)0x0) {
          (**(code **)(*local_1f8 + 0x10))();
        }
      }
      (*this->linop->_vptr_MLLinOp[0x2e])();
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 8;
    } while ((ulong)(iVar10 - 1) << 3 != lVar16);
  }
  if (1 < this->finest_amr_lev) {
    uVar15 = 1;
    lVar16 = 0x18;
    do {
      std::vector<amrex::Any,_std::allocator<amrex::Any>_>::resize
                ((vector<amrex::Any,_std::allocator<amrex::Any>_> *)
                 ((long)&(((this->cor_hold).
                           super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           .
                           super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                         super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar16),1);
      if (this->solve_called == 0) {
        local_1b8._8_4_ = local_1e8;
        local_1b8._0_8_ = local_1f0;
        if (this->cf_strategy == ghostnodes) {
          local_1b8._4_4_ = (*this->linop->_vptr_MLLinOp[6])(this->linop,uVar15 & 0xffffffff,0);
          local_1b8._0_4_ = local_1b8._4_4_;
          local_1b8._8_4_ = local_1b8._4_4_;
        }
        (*this->linop->_vptr_MLLinOp[0x27])
                  (&local_1f8,this->linop,uVar15 & 0xffffffff,0,
                   (_Head_base<0UL,_amrex::Any::innards_base_*,_false> *)local_1b8);
        plVar8 = local_1f8;
        plVar5 = *(long **)((long)&(((this->cor_hold).
                                     super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                     .
                                     super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar16);
        local_1f8 = (long *)0x0;
        plVar6 = (long *)*plVar5;
        *plVar5 = (long)plVar8;
        if (plVar6 != (long *)0x0) {
          (**(code **)(*plVar6 + 0x10))();
        }
        if (local_1f8 != (long *)0x0) {
          (**(code **)(*local_1f8 + 0x10))();
        }
      }
      (*this->linop->_vptr_MLLinOp[0x2e])
                (this->linop,
                 *(undefined8 *)
                  ((long)&(((this->cor_hold).
                            super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                          super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                          super__Vector_impl_data._M_start + lVar16));
      uVar15 = uVar15 + 1;
      lVar16 = lVar16 + 0x18;
    } while ((long)uVar15 < (long)this->finest_amr_lev);
  }
  if (this->linop->m_parent == (MLLinOp *)0x0) {
    iVar10 = (*this->linop->_vptr_MLLinOp[0x25])();
    if ((char)iVar10 != '\0') {
      if ((this->do_nsolve != 0) &&
         ((this->ns_linop)._M_t.
          super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
          super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
          super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl == (MLLinOp *)0x0)) {
        prepareForNSolve(this);
      }
      goto LAB_00629c25;
    }
  }
  this->do_nsolve = 0;
LAB_00629c25:
  if (1 < this->verbose) {
    local_1b8._8_8_ = OutStream();
    local_1b8._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
    local_1b8._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    *(undefined8 *)((long)auStack_1a0 + *(long *)((long)local_1a8._M_head_impl + -0x18)) =
         *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"MLMG: # of AMR levels: ",0x17);
    std::ostream::operator<<(&local_1a8,this->namrlevs);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"      # of MG levels on the coarsest AMR level: ",0x30);
    std::ostream::operator<<
              (&local_1a8,
               *(this->linop->m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
    Print::~Print((Print *)local_1b8);
    if ((this->ns_linop)._M_t.
        super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>._M_t.
        super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>.
        super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl != (MLLinOp *)0x0) {
      local_1b8._8_8_ = OutStream();
      local_1b8._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_1b8._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      *(undefined8 *)((long)auStack_1a0 + *(long *)((long)local_1a8._M_head_impl + -0x18)) =
           *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"      # of MG levels in N-Solve: ",0x21);
      std::ostream::operator<<
                (&local_1a8,
                 **(int **)&(((this->ns_linop)._M_t.
                              super___uniq_ptr_impl<amrex::MLLinOp,_std::default_delete<amrex::MLLinOp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::MLLinOp_*,_std::default_delete<amrex::MLLinOp>_>
                              .super__Head_base<0UL,_amrex::MLLinOp_*,_false>._M_head_impl)->
                            m_num_mg_levels).super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"      # of grids in N-Solve: ",0x1d);
      std::ostream::_M_insert<long>((long)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"\n",1);
      Print::~Print((Print *)local_1b8);
    }
  }
  return;
}

Assistant:

void
MLMG::prepareForSolve (Vector<Any>& a_sol, const Vector<Any>& a_rhs)
{
    BL_PROFILE("MLMG::prepareForSolve()");

    AMREX_ASSERT(namrlevs <= a_sol.size());
    AMREX_ASSERT(namrlevs <= a_rhs.size());

    timer.assign(ntimers, 0.0);

    IntVect ng_rhs(0);
    IntVect ng_sol(1);
    if (linop.hasHiddenDimension()) ng_sol[linop.hiddenDirection()] = 0;

    if (!linop_prepared) {
        linop.prepareForSolve();
        linop_prepared = true;
    } else if (linop.needsUpdate()) {
        linop.update();

#if defined(AMREX_USE_HYPRE) && (AMREX_SPACEDIM > 1)
        hypre_solver.reset();
        hypre_bndry.reset();
        hypre_node_solver.reset();
#endif

#ifdef AMREX_USE_PETSC
        petsc_solver.reset();
        petsc_bndry.reset();
#endif
    }

    sol.resize(namrlevs);
    sol_is_alias.resize(namrlevs);
    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (cf_strategy == CFStrategy::ghostnodes)
        {
            sol[alev] = linop.AnyMakeAlias(a_sol[alev]);
            sol_is_alias[alev] = true;
        }
        else if (linop.AnyGrowVect(a_sol[alev]) == ng_sol)
        {
            sol[alev] = linop.AnyMakeAlias(a_sol[alev]);
            linop.AnySetBndryToZero(sol[alev]);
            sol_is_alias[alev] = true;
        }
        else
        {
            if (!solve_called) {
                sol[alev] = linop.AnyMake(alev, 0, ng_sol);
            }
            linop.AnyCopy(sol[alev], a_sol[alev], IntVect(0));
            linop.AnySetBndryToZero(sol[alev]);
            sol_is_alias[alev] = false;
        }
    }

    rhs.resize(namrlevs);
    for (int alev = 0; alev < namrlevs; ++alev)
    {
        if (cf_strategy == CFStrategy::ghostnodes) ng_rhs = IntVect(linop.getNGrow(alev));
        if (!solve_called) {
            rhs[alev] = linop.AnyMake(alev, 0, ng_rhs);
        }
        linop.AnyCopy(rhs[alev], a_rhs[alev], ng_rhs);
        linop.applyMetricTerm(alev, 0, rhs[alev]);
        linop.unimposeNeumannBC(alev, rhs[alev]);
        linop.applyInhomogNeumannTerm(alev, rhs[alev]);
        linop.applyOverset(alev, rhs[alev]);
        linop.scaleRHS(alev, rhs[alev]);

#ifdef AMREX_USE_EB
        auto factory = dynamic_cast<EBFArrayBoxFactory const*>(linop.Factory(alev));
        if (factory) {
            linop.AnySetCoveredToZero(rhs[alev]);
            linop.AnySetCoveredToZero(sol[alev]);
        }
#endif
    }

    for (int falev = finest_amr_lev; falev > 0; --falev)
    {
        linop.AnyAverageDownSolutionRHS(falev-1, sol[falev-1], rhs[falev-1],
                                        sol[falev], rhs[falev]);
    }

    // enforce solvability if appropriate
    if (linop.isSingular(0) && linop.getEnforceSingularSolvable())
    {
        makeSolvable();
    }

    IntVect ng = linop.isCellCentered() ? IntVect(0) : IntVect(1);
    if (cf_strategy == CFStrategy::ghostnodes) ng = ng_rhs;
    if (!solve_called) {
        linop.make(res, ng);
        linop.make(rescor, ng);
    }
    for (int alev = 0; alev <= finest_amr_lev; ++alev)
    {
        const int nmglevs = linop.NMGLevels(alev);
        for (int mglev = 0; mglev < nmglevs; ++mglev)
        {
            linop.AnySetToZero(res   [alev][mglev]);
            linop.AnySetToZero(rescor[alev][mglev]);
        }
    }

    if (cf_strategy != CFStrategy::ghostnodes) ng = ng_sol;
    cor.resize(namrlevs);
    for (int alev = 0; alev <= finest_amr_lev; ++alev)
    {
        const int nmglevs = linop.NMGLevels(alev);
        cor[alev].resize(nmglevs);
        for (int mglev = 0; mglev < nmglevs; ++mglev)
        {
            if (!solve_called) {
                IntVect _ng = ng;
                if (cf_strategy == CFStrategy::ghostnodes) _ng=IntVect(linop.getNGrow(alev,mglev));
                cor[alev][mglev] = linop.AnyMake(alev, mglev, _ng);
            }
            linop.AnySetToZero(cor[alev][mglev]);
        }
    }

    cor_hold.resize(std::max(namrlevs-1,1));
    {
        const int alev = 0;
        const int nmglevs = linop.NMGLevels(alev);
        cor_hold[alev].resize(nmglevs);
        for (int mglev = 0; mglev < nmglevs-1; ++mglev)
        {
            if (!solve_called) {
                IntVect _ng = ng;
                if (cf_strategy == CFStrategy::ghostnodes) _ng=IntVect(linop.getNGrow(alev,mglev));
                cor_hold[alev][mglev] = linop.AnyMake(alev, mglev, _ng);
            }
            linop.AnySetToZero(cor_hold[alev][mglev]);
        }
    }
    for (int alev = 1; alev < finest_amr_lev; ++alev)
    {
        cor_hold[alev].resize(1);
        if (!solve_called) {
            IntVect _ng = ng;
            if (cf_strategy == CFStrategy::ghostnodes) _ng=IntVect(linop.getNGrow(alev));
            cor_hold[alev][0] = linop.AnyMake(alev, 0, _ng);
        }
        linop.AnySetToZero(cor_hold[alev][0]);
    }

    if (linop.m_parent) {
        do_nsolve = false;  // no embedded N-Solve
    } else if (!linop.supportNSolve()) {
        do_nsolve = false;
    }

    if (do_nsolve && ns_linop == nullptr)
    {
        prepareForNSolve();
    }

    if (verbose >= 2) {
        amrex::Print() << "MLMG: # of AMR levels: " << namrlevs << "\n"
                       << "      # of MG levels on the coarsest AMR level: " << linop.NMGLevels(0)
                       << "\n";
        if (ns_linop) {
            amrex::Print() << "      # of MG levels in N-Solve: " << ns_linop->NMGLevels(0) << "\n"
                           << "      # of grids in N-Solve: " << ns_linop->m_grids[0][0].size() << "\n";
        }
    }
}